

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFOutlineDocumentHelper::resolveNamedDest(QPDFOutlineDocumentHelper *this,QPDFObjectHandle *name)

{
  undefined8 uVar1;
  bool bVar2;
  QPDFObjectHandle *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *peVar3;
  QPDFNameTreeObjectHelper *this_00;
  QPDFObjectHandle QVar4;
  QPDFObjectHandle result;
  QPDFObjectHandle dests;
  allocator<char> local_aa;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [24];
  undefined1 local_70 [16];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60 [2];
  undefined1 local_40 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_88._0_8_ = (element_type *)0x0;
  local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar2 = QPDFObjectHandle::isName(in_RDX);
  if (bVar2) {
    peVar3 = name[1].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar3->qpdf == (QPDF *)0x0) {
      QPDF::getRoot((QPDF *)local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"/Dests",(allocator<char> *)local_40);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_70 + 0x10),(string *)local_70);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &(name[1].super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qpdf,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x18));
      std::__cxx11::string::~string((string *)&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
      peVar3 = name[1].super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    QPDFObjectHandle::getName_abi_cxx11_(&local_a8,in_RDX);
    QPDFObjectHandle::getKeyIfDict((QPDFObjectHandle *)(local_70 + 0x10),(string *)&peVar3->qpdf);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_88,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x18));
  }
  else {
    bVar2 = QPDFObjectHandle::isString(in_RDX);
    if (!bVar2) goto LAB_001a1bf6;
    this_00 = (QPDFNameTreeObjectHelper *)
              (name[1].super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parsed_offset;
    if (this_00 == (QPDFNameTreeObjectHelper *)0x0) {
      QPDF::getRoot((QPDF *)(local_40 + 0x10));
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"/Names",&local_a9);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_40,(string *)(local_40 + 0x10));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_70 + 0x10),"/Dests",&local_aa);
      QPDFObjectHandle::getKeyIfDict((QPDFObjectHandle *)local_70,(string *)local_40);
      std::__cxx11::string::~string((string *)(local_70 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
      std::__cxx11::string::~string((string *)&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
      bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_70);
      if (bVar2) {
        std::make_shared<QPDFNameTreeObjectHelper,QPDFObjectHandle&,QPDF&>
                  ((QPDFObjectHandle *)&local_a8,(QPDF *)local_70);
        std::__shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2> *)
                   &(name[1].super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    parsed_offset,
                   (__shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
      this_00 = (QPDFNameTreeObjectHelper *)
                (name[1].super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parsed_offset;
      if (this_00 == (QPDFNameTreeObjectHelper *)0x0) goto LAB_001a1bf6;
    }
    QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_a8,in_RDX);
    QPDFNameTreeObjectHelper::findObject(this_00,&local_a8,(QPDFObjectHandle *)local_88);
  }
  std::__cxx11::string::~string((string *)&local_a8);
LAB_001a1bf6:
  if ((element_type *)local_88._0_8_ == (element_type *)0x0) {
    QPDFObjectHandle::newNull();
  }
  else {
    bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_88);
    uVar1 = local_88._8_8_;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"/D",(allocator<char> *)(local_70 + 0x10));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    else {
      local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper = (_func_int **)local_88._0_8_;
      (this->super_QPDFDocumentHelper).qpdf = (QPDF *)uVar1;
      local_88._0_8_ = (element_type *)0x0;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFOutlineDocumentHelper::resolveNamedDest(QPDFObjectHandle name)
{
    QPDFObjectHandle result;
    if (name.isName()) {
        if (!m->dest_dict) {
            m->dest_dict = qpdf.getRoot().getKey("/Dests");
        }
        QTC::TC("qpdf", "QPDFOutlineDocumentHelper name named dest");
        result = m->dest_dict.getKeyIfDict(name.getName());
    } else if (name.isString()) {
        if (!m->names_dest) {
            auto dests = qpdf.getRoot().getKey("/Names").getKeyIfDict("/Dests");
            if (dests.isDictionary()) {
                m->names_dest = std::make_shared<QPDFNameTreeObjectHelper>(dests, qpdf);
            }
        }
        if (m->names_dest) {
            if (m->names_dest->findObject(name.getUTF8Value(), result)) {
                QTC::TC("qpdf", "QPDFOutlineDocumentHelper string named dest");
            }
        }
    }
    if (!result) {
        return QPDFObjectHandle::newNull();
    }
    if (result.isDictionary()) {
        QTC::TC("qpdf", "QPDFOutlineDocumentHelper named dest dictionary");
        return result.getKey("/D");
    }
    return result;
}